

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O3

void __thiscall
CLI::ArgumentMismatch::ArgumentMismatch
          (ArgumentMismatch *this,string *name,int expected,size_t recieved)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  size_t sVar10;
  size_t sVar11;
  size_type *psVar12;
  uint uVar13;
  char cVar14;
  ulong uVar15;
  uint uVar16;
  string __str;
  ulong *local_120;
  uint local_118;
  undefined4 uStack_114;
  ulong local_110 [2];
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  string local_e0;
  ArgumentMismatch *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  char *local_58 [2];
  char local_48 [16];
  size_t local_38;
  
  if (expected < 1) {
    uVar13 = -expected;
    uVar16 = 1;
    if (9 < uVar13) {
      uVar7 = uVar13;
      uVar3 = 4;
      do {
        uVar16 = uVar3;
        if (uVar7 < 100) {
          uVar16 = uVar16 - 2;
          goto LAB_00149f77;
        }
        if (uVar7 < 1000) {
          uVar16 = uVar16 - 1;
          goto LAB_00149f77;
        }
        if (uVar7 < 10000) goto LAB_00149f77;
        bVar2 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar3 = uVar16 + 4;
      } while (bVar2);
      uVar16 = uVar16 + 1;
    }
LAB_00149f77:
    local_58[0] = local_48;
    local_c0 = this;
    local_38 = recieved;
    ::std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar16 - (char)((int)uVar13 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58[0] + (uVar13 >> 0x1f),uVar16,uVar13);
    puVar6 = (undefined8 *)::std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x174bbe);
    sVar10 = local_38;
    local_b8 = &local_a8;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_a8 = *plVar5;
      lStack_a0 = puVar6[3];
    }
    else {
      local_a8 = *plVar5;
      local_b8 = (long *)*puVar6;
    }
    local_b0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_b8);
    local_98 = &local_88;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_88 = *plVar5;
      lStack_80 = puVar6[3];
    }
    else {
      local_88 = *plVar5;
      local_98 = (long *)*puVar6;
    }
    local_90 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_98,(ulong)(name->_M_dataplus)._M_p);
    local_78 = &local_68;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = puVar6[3];
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*puVar6;
    }
    local_70 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_78);
    puVar9 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar9) {
      local_f0 = *puVar9;
      lStack_e8 = puVar6[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar9;
      local_100 = (ulong *)*puVar6;
    }
    local_f8 = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    cVar14 = '\x01';
    if (9 < sVar10) {
      sVar11 = sVar10;
      cVar4 = '\x04';
      do {
        cVar14 = cVar4;
        if (sVar11 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0014a197;
        }
        if (sVar11 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0014a197;
        }
        if (sVar11 < 10000) goto LAB_0014a197;
        bVar2 = 99999 < sVar11;
        sVar11 = sVar11 / 10000;
        cVar4 = cVar14 + '\x04';
      } while (bVar2);
      cVar14 = cVar14 + '\x01';
    }
LAB_0014a197:
    local_120 = local_110;
    ::std::__cxx11::string::_M_construct((ulong)&local_120,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_120,local_118,sVar10);
    uVar1 = CONCAT44(uStack_114,local_118) + local_f8;
    uVar15 = 0xf;
    if (local_100 != &local_f0) {
      uVar15 = local_f0;
    }
    if (uVar15 < uVar1) {
      uVar15 = 0xf;
      if (local_120 != local_110) {
        uVar15 = local_110[0];
      }
      if (uVar15 < uVar1) goto LAB_0014a1ff;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_100);
    }
    else {
LAB_0014a1ff:
      puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_120);
    }
    local_e0._M_dataplus._M_p = (pointer)*puVar6;
    psVar12 = puVar6 + 2;
    this = local_c0;
    if ((size_type *)local_e0._M_dataplus._M_p == psVar12) goto LAB_0014a237;
  }
  else {
    uVar13 = 1;
    if (9 < (uint)expected) {
      uVar16 = expected;
      uVar7 = 4;
      do {
        uVar13 = uVar7;
        if (uVar16 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_00149cad;
        }
        if (uVar16 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_00149cad;
        }
        if (uVar16 < 10000) goto LAB_00149cad;
        bVar2 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        uVar7 = uVar13 + 4;
      } while (bVar2);
      uVar13 = uVar13 + 1;
    }
LAB_00149cad:
    local_58[0] = local_48;
    ::std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar13);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58[0],uVar13,expected);
    plVar5 = (long *)::std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x174b96);
    local_b8 = &local_a8;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_a8 = *plVar8;
      lStack_a0 = plVar5[3];
    }
    else {
      local_a8 = *plVar8;
      local_b8 = (long *)*plVar5;
    }
    local_b0 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_b8);
    local_98 = &local_88;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_88 = *plVar8;
      lStack_80 = plVar5[3];
    }
    else {
      local_88 = *plVar8;
      local_98 = (long *)*plVar5;
    }
    local_90 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)(name->_M_dataplus)._M_p);
    local_78 = &local_68;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_68 = *plVar8;
      lStack_60 = plVar5[3];
    }
    else {
      local_68 = *plVar8;
      local_78 = (long *)*plVar5;
    }
    local_70 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_78);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_f0 = *puVar9;
      lStack_e8 = plVar5[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar9;
      local_100 = (ulong *)*plVar5;
    }
    local_f8 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cVar14 = '\x01';
    if (9 < recieved) {
      sVar10 = recieved;
      cVar4 = '\x04';
      do {
        cVar14 = cVar4;
        if (sVar10 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_00149ebb;
        }
        if (sVar10 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_00149ebb;
        }
        if (sVar10 < 10000) goto LAB_00149ebb;
        bVar2 = 99999 < sVar10;
        sVar10 = sVar10 / 10000;
        cVar4 = cVar14 + '\x04';
      } while (bVar2);
      cVar14 = cVar14 + '\x01';
    }
LAB_00149ebb:
    local_120 = local_110;
    ::std::__cxx11::string::_M_construct((ulong)&local_120,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_120,local_118,recieved);
    uVar1 = CONCAT44(uStack_114,local_118) + local_f8;
    uVar15 = 0xf;
    if (local_100 != &local_f0) {
      uVar15 = local_f0;
    }
    if (uVar15 < uVar1) {
      uVar15 = 0xf;
      if (local_120 != local_110) {
        uVar15 = local_110[0];
      }
      if (uVar15 < uVar1) goto LAB_00149f26;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_100);
    }
    else {
LAB_00149f26:
      puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_120);
    }
    local_e0._M_dataplus._M_p = (pointer)*puVar6;
    psVar12 = puVar6 + 2;
    if ((size_type *)local_e0._M_dataplus._M_p == psVar12) {
LAB_0014a237:
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      local_e0.field_2._M_allocated_capacity = *psVar12;
      local_e0.field_2._8_8_ = psVar12[1];
      goto LAB_0014a23d;
    }
  }
  local_e0.field_2._M_allocated_capacity = *psVar12;
LAB_0014a23d:
  local_e0._M_string_length = puVar6[1];
  *puVar6 = psVar12;
  puVar6[1] = 0;
  *(undefined1 *)psVar12 = 0;
  ArgumentMismatch(this,&local_e0,ArgumentMismatch);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_120 != local_110) {
    operator_delete(local_120);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return;
}

Assistant:

ArgumentMismatch(std::string name, int expected, size_t recieved)
        : ArgumentMismatch(expected > 0 ? ("Expected exactly " + std::to_string(expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved))
                                        : ("Expected at least " + std::to_string(-expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved)),
                           ExitCodes::ArgumentMismatch) {}